

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O1

S2Cap * __thiscall S2CellUnion::GetCapBound(S2Cap *__return_storage_ptr__,S2CellUnion *this)

{
  double *pdVar1;
  double *pdVar2;
  pointer pSVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  double *ap;
  pointer pSVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  S2CellId id;
  double local_d8 [4];
  VType local_b8;
  double local_b0;
  VType local_a8;
  double local_a0;
  undefined1 local_98 [8];
  ostream *poStack_90;
  double local_88;
  S2Cap local_58;
  
  pSVar7 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar7 == (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  else {
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar9 = 0.0;
    dVar10 = 0.0;
    dVar8 = 0.0;
    if (pSVar7 != pSVar3) {
      dVar8 = 0.0;
      dVar10 = 0.0;
      dVar9 = 0.0;
      do {
        local_58.super_S2Region._vptr_S2Region = (_func_int **)pSVar7->id_;
        if (local_58.super_S2Region._vptr_S2Region == (_func_int **)0x0) {
          local_d8[0] = dVar8;
          local_d8[1] = dVar10;
          local_d8[2] = dVar9;
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_98,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                     ,0x223,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poStack_90,"Check failed: id_ != 0 ",0x17);
          goto LAB_001dfae0;
        }
        uVar4 = 0;
        if (local_58.super_S2Region._vptr_S2Region != (_func_int **)0x0) {
          for (; ((ulong)local_58.super_S2Region._vptr_S2Region >> uVar4 & 1) == 0;
              uVar4 = uVar4 + 1) {
          }
        }
        local_b8 = dVar8;
        local_b0 = dVar10;
        local_a8 = dVar9;
        local_a0 = S2Cell::AverageArea(0x1e - ((uint)(uVar4 >> 1) & 0x7fffffff));
        S2CellId::ToPoint((S2Point *)local_98,(S2CellId *)&local_58);
        dVar8 = (double)local_98 * local_a0 + local_b8;
        dVar10 = (double)poStack_90 * local_a0 + local_b0;
        dVar9 = local_a0 * local_88 + local_a8;
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar3);
    }
    local_d8[1] = dVar10;
    local_d8[2] = dVar9;
    local_98 = (undefined1  [8])0x0;
    poStack_90 = (ostream *)0x0;
    local_88 = 0.0;
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      lVar6 = 8;
      do {
        if (lVar6 == 0x18) {
          local_d8[1] = 0.0;
          local_d8[0] = 1.0;
          local_d8[2] = 0.0;
          goto LAB_001df9d8;
        }
        pdVar1 = (double *)((long)local_d8 + lVar6);
        pdVar2 = (double *)(local_98 + lVar6);
        lVar6 = lVar6 + 8;
      } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
    }
    dVar11 = dVar9 * dVar9 + dVar10 * dVar10 + dVar8 * dVar8;
    if (dVar11 < 0.0) {
      local_d8[0] = dVar8;
      local_b8 = dVar9;
      local_b0 = dVar10;
      local_a8 = dVar8;
      dVar11 = sqrt(dVar11);
      dVar8 = local_a8;
      dVar10 = local_b0;
      dVar9 = local_b8;
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar11 = (double)(~-(ulong)(dVar11 != 0.0) & (ulong)dVar11 |
                     (ulong)(1.0 / dVar11) & -(ulong)(dVar11 != 0.0));
    local_d8[0] = dVar8 * dVar11;
    local_d8[1] = dVar10 * dVar11;
    local_d8[2] = dVar9 * dVar11;
LAB_001df9d8:
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
    (__return_storage_ptr__->center_).c_[0] = local_d8[0];
    (__return_storage_ptr__->center_).c_[1] = local_d8[1];
    (__return_storage_ptr__->center_).c_[2] = local_d8[2];
    bVar5 = S2::IsUnitLength(&__return_storage_ptr__->center_);
    if ((!bVar5) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (poStack_90,"Check failed: is_valid() ",0x19);
LAB_001dfae0:
      abort();
    }
    pSVar7 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar7 != pSVar3) {
      do {
        S2Cell::S2Cell((S2Cell *)local_98,(S2CellId)pSVar7->id_);
        S2Cell::GetCapBound(&local_58,(S2Cell *)local_98);
        S2Cap::AddCap(__return_storage_ptr__,&local_58);
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2CellUnion::GetCapBound() const {
  // Compute the approximate centroid of the region.  This won't produce the
  // bounding cap of minimal area, but it should be close enough.
  if (cell_ids_.empty()) return S2Cap::Empty();
  S2Point centroid(0, 0, 0);
  for (S2CellId id : *this) {
    double area = S2Cell::AverageArea(id.level());
    centroid += area * id.ToPoint();
  }
  if (centroid == S2Point(0, 0, 0)) {
    centroid = S2Point(1, 0, 0);
  } else {
    centroid = centroid.Normalize();
  }

  // Use the centroid as the cap axis, and expand the cap angle so that it
  // contains the bounding caps of all the individual cells.  Note that it is
  // *not* sufficient to just bound all the cell vertices because the bounding
  // cap may be concave (i.e. cover more than one hemisphere).
  S2Cap cap = S2Cap::FromPoint(centroid);
  for (S2CellId id : *this) {
    cap.AddCap(S2Cell(id).GetCapBound());
  }
  return cap;
}